

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::BinaryExpr<const_BoolTest_&,_const_BoolTest_&>::streamReconstructedExpression
          (BinaryExpr<const_BoolTest_&,_const_BoolTest_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  char *pcVar2;
  StringRef op;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pcVar2 = "false";
  pcVar1 = "false";
  if ((ulong)*this->m_lhs != 0) {
    pcVar1 = "true";
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,pcVar1,pcVar1 + ((ulong)*this->m_lhs ^ 5));
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  if ((ulong)*this->m_rhs != 0) {
    pcVar2 = "true";
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,pcVar2,pcVar2 + ((ulong)*this->m_rhs ^ 5));
  op.m_size = (size_type)local_50;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)local_70,lhs,op,in_R9);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }